

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O2

void __thiscall chrono::fea::ChElementCableANCF::ComputeNF(ChElementCableANCF *this)

{
  ChVectorDynamic<> *in_RCX;
  double *in_RDX;
  ChVectorDynamic<> *in_RSI;
  ChVectorDynamic<> *in_R8;
  ChVectorDynamic<> *in_R9;
  double in_XMM0_Qa;
  
  ComputeNF((ChElementCableANCF *)
            (this[-1].m_MassMatrix.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.
             m_storage.m_data.array + 0x8e),in_XMM0_Qa,in_RSI,in_RDX,in_RCX,in_R8,in_R9);
  return;
}

Assistant:

void ChElementCableANCF::ComputeNF(const double U,
                                   ChVectorDynamic<>& Qi,
                                   double& detJ,
                                   const ChVectorDynamic<>& F,
                                   ChVectorDynamic<>* state_x,
                                   ChVectorDynamic<>* state_w) {
    ShapeVector N;
    this->ShapeFunctions(N, (U + 1) * 0.5);  // evaluate shape functions (in compressed vector)

    detJ = this->GetRestLength() / 2.0;

    Qi.segment(0, 3) = N(0) * F.segment(0, 3);
    Qi.segment(3, 3) = N(1) * F.segment(0, 3);
    Qi.segment(6, 3) = N(2) * F.segment(0, 3);
    Qi.segment(9, 3) = N(3) * F.segment(0, 3);
}